

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall Node::OutputBstringText_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x1d4) {
    Expression_abi_cxx11_(&local_40,this);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x12d0ea);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_50 = *plVar2;
      lStack_48 = plVar1[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar2;
      local_60 = (long *)*plVar1;
    }
    local_58 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar1[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_80._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    Expression_abi_cxx11_(&local_80,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    local_40.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_40._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputBstringText(void)
{
	std::string result;

	switch(Type)
	{
	case BAS_V_TEXTSTRING:
		result = "std::string(" + Expression() + ")";
		break;

	default:
		result = Expression();
		break;
	}

	return result;
}